

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void SyZero(void *pSrc,sxu32 nSize)

{
  undefined1 *puVar1;
  uchar *zSrc;
  
  puVar1 = (undefined1 *)((ulong)nSize + (long)pSrc);
  while( true ) {
    if (puVar1 <= pSrc) {
      return;
    }
    *(undefined1 *)pSrc = 0;
    if (puVar1 <= (undefined1 *)((long)pSrc + 1)) {
      return;
    }
    *(undefined1 *)((long)pSrc + 1) = 0;
    if (puVar1 <= (undefined1 *)((long)pSrc + 2)) {
      return;
    }
    *(undefined1 *)((long)pSrc + 2) = 0;
    if (puVar1 <= (undefined1 *)((long)pSrc + 3)) break;
    *(undefined1 *)((long)pSrc + 3) = 0;
    pSrc = (void *)((long)pSrc + 4);
  }
  return;
}

Assistant:

JX9_PRIVATE void SyZero(void *pSrc, sxu32 nSize)
{
	register unsigned char *zSrc = (unsigned char *)pSrc;
	unsigned char *zEnd;
#if defined(UNTRUST)
	if( zSrc == 0 || nSize <= 0 ){
		return ;
	}
#endif
	zEnd = &zSrc[nSize];
	for(;;){
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
	}
}